

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::DoubletonEquationPS::DoubletonEquationPS
          (DoubletonEquationPS *this,DoubletonEquationPS *old)

{
  undefined8 uVar1;
  long in_RSI;
  PostStep *in_RDI;
  PostStep *in_stack_ffffffffffffffe0;
  
  PostStep::PostStep(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI->_vptr_PostStep = (_func_int **)&PTR__DoubletonEquationPS_00897a68;
  *(undefined4 *)&in_RDI[1]._vptr_PostStep = *(undefined4 *)(in_RSI + 0x28);
  *(undefined4 *)((long)&in_RDI[1]._vptr_PostStep + 4) = *(undefined4 *)(in_RSI + 0x2c);
  *(undefined4 *)&in_RDI[1].m_name = *(undefined4 *)(in_RSI + 0x30);
  *(byte *)((long)&in_RDI[1].m_name + 4) = *(byte *)(in_RSI + 0x34) & 1;
  *(byte *)((long)&in_RDI[1].m_name + 5) = *(byte *)(in_RSI + 0x35) & 1;
  uVar1 = *(undefined8 *)(in_RSI + 0x38);
  in_RDI[1].nCols = (int)uVar1;
  in_RDI[1].nRows = (int)((ulong)uVar1 >> 0x20);
  in_RDI[1]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(in_RSI + 0x40);
  in_RDI[1]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x48);
  *(byte *)&in_RDI[2]._vptr_PostStep = *(byte *)(in_RSI + 0x50) & 1;
  *(byte *)((long)&in_RDI[2]._vptr_PostStep + 1) = *(byte *)(in_RSI + 0x51) & 1;
  in_RDI[2].m_name = *(char **)(in_RSI + 0x58);
  uVar1 = *(undefined8 *)(in_RSI + 0x60);
  in_RDI[2].nCols = (int)uVar1;
  in_RDI[2].nRows = (int)((ulong)uVar1 >> 0x20);
  in_RDI[2]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(in_RSI + 0x68);
  in_RDI[2]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x70);
  in_RDI[3]._vptr_PostStep = *(_func_int ***)(in_RSI + 0x78);
  in_RDI[3].m_name = *(char **)(in_RSI + 0x80);
  uVar1 = *(undefined8 *)(in_RSI + 0x88);
  in_RDI[3].nCols = (int)uVar1;
  in_RDI[3].nRows = (int)((ulong)uVar1 >> 0x20);
  in_RDI[3]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(in_RSI + 0x90);
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)in_stack_ffffffffffffffe0,(DSVectorBase<double> *)in_RDI);
  return;
}

Assistant:

DoubletonEquationPS(const DoubletonEquationPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_k(old.m_k)
         , m_i(old.m_i)
         , m_maxSense(old.m_maxSense)
         , m_jFixed(old.m_jFixed)
         , m_jObj(old.m_jObj)
         , m_kObj(old.m_kObj)
         , m_aij(old.m_aij)
         , m_strictLo(old.m_strictLo)
         , m_strictUp(old.m_strictUp)
         , m_newLo(old.m_newLo)
         , m_newUp(old.m_newUp)
         , m_oldLo(old.m_oldLo)
         , m_oldUp(old.m_oldUp)
         , m_Lo_j(old.m_Lo_j)
         , m_Up_j(old.m_Up_j)
         , m_lhs(old.m_lhs)
         , m_rhs(old.m_rhs)
         , m_col(old.m_col)
      {}